

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
BinaryExpr<const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&,_const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&,_const_ezy::strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>
  *in_RDX;
  strong_type<int,_Tag,_ezy::features::less,_ezy::features::left_shiftable_with<std::basic_ostream<char,_std::char_traits<char>_>_&>_>
  *value;
  string *in_R9;
  StringRef op;
  type local_60;
  type local_40;
  
  StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
  ::
  convert<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>>
            (&local_40,
             (StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
              *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
  ::
  convert<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>>
            (&local_60,
             (StringMaker<ezy::strong_type<int,Tag,ezy::features::less,ezy::features::left_shiftable_with<std::ostream&>>,void>
              *)this->m_rhs,value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }